

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O2

void __thiscall ExampleAppConsole::ClearLog(ExampleAppConsole *this)

{
  char **ppcVar1;
  ImVector<char_*> *this_00;
  int i;
  int i_00;
  
  this_00 = &this->Items;
  for (i_00 = 0; i_00 < this_00->Size; i_00 = i_00 + 1) {
    ppcVar1 = ImVector<char_*>::operator[](this_00,i_00);
    free(*ppcVar1);
  }
  ImVector<char_*>::clear(this_00);
  return;
}

Assistant:

void    ClearLog()
    {
        for (int i = 0; i < Items.Size; i++)
            free(Items[i]);
        Items.clear();
    }